

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O0

bool __thiscall QComboBox::event(QComboBox *this,QEvent *event)

{
  long lVar1;
  byte bVar2;
  Type TVar3;
  QComboBoxPrivate *this_00;
  QComboBoxPrivate *in_RSI;
  QComboBoxPrivate *in_RDI;
  long in_FS_OFFSET;
  QHoverEvent *he;
  QComboBoxPrivate *d;
  QEvent *in_stack_000000e8;
  QWidget *in_stack_000000f0;
  undefined4 in_stack_ffffffffffffffb0;
  bool local_21;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QComboBox *)0x53c73f);
  TVar3 = QEvent::type((QEvent *)in_RSI);
  if (TVar3 == ApplicationLayoutDirectionChange) {
LAB_0053c786:
    QComboBoxPrivate::updateLayoutDirection(in_RDI);
    QComboBoxPrivate::updateLineEditGeometry(in_RSI);
  }
  else if (TVar3 == ShortcutOverride) {
    if (this_00->lineEdit != (QLineEdit *)0x0) {
      bVar2 = (**(code **)(*(long *)&this_00->lineEdit->super_QWidget + 0x28))
                        (this_00->lineEdit,in_RSI);
      local_21 = (bool)(bVar2 & 1);
      goto LAB_0053c838;
    }
  }
  else {
    if (TVar3 == LayoutDirectionChange) goto LAB_0053c786;
    if ((TVar3 - HoverEnter < 3) && (in_RSI != (QComboBoxPrivate *)0x0)) {
      QSinglePointEvent::position((QSinglePointEvent *)0x53c7c5);
      QPointF::toPoint((QPointF *)CONCAT44(TVar3,in_stack_ffffffffffffffb0));
      QComboBoxPrivate::updateHoverControl(this_00,(QPoint *)in_RSI);
    }
  }
  local_21 = QWidget::event(in_stack_000000f0,in_stack_000000e8);
LAB_0053c838:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_21;
}

Assistant:

bool QComboBox::event(QEvent *event)
{
    Q_D(QComboBox);
    switch(event->type()) {
    case QEvent::LayoutDirectionChange:
    case QEvent::ApplicationLayoutDirectionChange:
        d->updateLayoutDirection();
        d->updateLineEditGeometry();
        break;
    case QEvent::HoverEnter:
    case QEvent::HoverLeave:
    case QEvent::HoverMove:
        if (const QHoverEvent *he = static_cast<const QHoverEvent *>(event))
            d->updateHoverControl(he->position().toPoint());
        break;
    case QEvent::ShortcutOverride:
        if (d->lineEdit)
            return d->lineEdit->event(event);
        break;
#ifdef QT_KEYPAD_NAVIGATION
    case QEvent::EnterEditFocus:
        if (d->lineEdit)
            d->lineEdit->event(event);  //so cursor starts
        break;
    case QEvent::LeaveEditFocus:
        if (d->lineEdit)
            d->lineEdit->event(event);  //so cursor stops
        break;
#endif
    default:
        break;
    }
    return QWidget::event(event);
}